

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int uv_timer_again(uv_timer_t *handle)

{
  uv_timer_t *handle_local;
  
  if (handle->timer_cb == (uv_timer_cb)0x0) {
    handle_local._4_4_ = -0x16;
  }
  else {
    if (handle->repeat != 0) {
      uv_timer_stop(handle);
      uv_timer_start(handle,handle->timer_cb,handle->repeat,handle->repeat);
    }
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_timer_again(uv_timer_t* handle) {
  if (handle->timer_cb == NULL)
    return -EINVAL;

  if (handle->repeat) {
    uv_timer_stop(handle);
    uv_timer_start(handle, handle->timer_cb, handle->repeat, handle->repeat);
  }

  return 0;
}